

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_perform_authentication(Curl_easy *data,connectdata *conn)

{
  SASL *sasl;
  curl_trc_feat *pcVar1;
  _Bool _Var2;
  CURLcode CVar3;
  undefined8 in_RAX;
  saslprogress progress;
  
  progress = (saslprogress)((ulong)in_RAX >> 0x20);
  if ((*(byte *)((long)&conn->proto + 0xfb) & 2) == 0) {
    sasl = &(conn->proto).imapc.sasl;
    _Var2 = Curl_sasl_can_authenticate(sasl,data);
    if (_Var2) {
      CVar3 = Curl_sasl_start(sasl,data,(_Bool)((*(byte *)((long)&conn->proto + 0xfb) & 0x10) >> 4),
                              &progress);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      if (progress == SASL_INPROGRESS) {
        (data->conn->proto).imapc.state = IMAP_AUTHENTICATE;
        return CURLE_OK;
      }
      if (((*(byte *)((long)&conn->proto + 0xfb) & 8) == 0) &&
         (((conn->proto).imapc.preftype & 1) != 0)) {
        CVar3 = imap_perform_login(data,conn);
        return CVar3;
      }
      if (data == (Curl_easy *)0x0) {
        return CURLE_LOGIN_DENIED;
      }
      if (((data->set).field_0x8cd & 0x10) != 0) {
        pcVar1 = (data->state).feat;
        if ((pcVar1 != (curl_trc_feat *)0x0) && (pcVar1->log_level < 1)) {
          return CURLE_LOGIN_DENIED;
        }
        Curl_infof(data,"No known authentication mechanisms supported");
        return CURLE_LOGIN_DENIED;
      }
      return CURLE_LOGIN_DENIED;
    }
  }
  (data->conn->proto).imapc.state = IMAP_STOP;
  return CURLE_OK;
}

Assistant:

static CURLcode imap_perform_authentication(struct Curl_easy *data,
                                            struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;
  saslprogress progress;

  /* Check if already authenticated OR if there is enough data to authenticate
     with and end the connect phase if we do not */
  if(imapc->preauth ||
     !Curl_sasl_can_authenticate(&imapc->sasl, data)) {
    imap_state(data, IMAP_STOP);
    return result;
  }

  /* Calculate the SASL login details */
  result = Curl_sasl_start(&imapc->sasl, data, imapc->ir_supported, &progress);

  if(!result) {
    if(progress == SASL_INPROGRESS)
      imap_state(data, IMAP_AUTHENTICATE);
    else if(!imapc->login_disabled && (imapc->preftype & IMAP_TYPE_CLEARTEXT))
      /* Perform clear text authentication */
      result = imap_perform_login(data, conn);
    else {
      /* Other mechanisms not supported */
      infof(data, "No known authentication mechanisms supported");
      result = CURLE_LOGIN_DENIED;
    }
  }

  return result;
}